

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O0

ON_UUID ON_UuidFromString(char *sUUID)

{
  byte bVar1;
  bool bVar2;
  ON_UUID OVar3;
  int iVar4;
  endian eVar5;
  byte *pbVar6;
  bool bVar7;
  int *local_68;
  char local_57 [3];
  int local_54;
  uchar byte_value [2];
  int iStack_50;
  uchar c;
  int ci;
  int bi;
  unsigned_short uStack_44;
  unsigned_short uStack_42;
  bool bFailed;
  anon_union_16_2_c96208d8 u;
  byte *local_20;
  char *sUUID_local;
  
  local_20 = (byte *)sUUID;
  if ((ON_UuidFromString(char_const*)::rho == '\0') &&
     (iVar4 = __cxa_guard_acquire(&ON_UuidFromString(char_const*)::rho), iVar4 != 0)) {
    eVar5 = ON::Endian();
    if (eVar5 == big_endian) {
      local_68 = big_endian_rho;
    }
    else {
      local_68 = little_endian_rho;
    }
    ON_UuidFromString::rho = local_68;
    __cxa_guard_release(&ON_UuidFromString(char_const*)::rho);
  }
  bi = 0;
  uStack_44 = 0;
  uStack_42 = 0;
  u._0_8_ = 0;
  bVar7 = local_20 == (byte *)0x0;
  if (!bVar7) {
    while( true ) {
      bVar2 = false;
      if (*local_20 != 0) {
        bVar2 = (char)*local_20 < '!';
      }
      if (!bVar2) break;
      local_20 = local_20 + 1;
    }
    if (*local_20 == 0x7b) {
      local_20 = local_20 + 1;
    }
    for (iStack_50 = 0; iStack_50 < 0x10; iStack_50 = iStack_50 + 1) {
      local_54 = 0;
      local_57[0] = '\0';
      local_57[1] = '\0';
      do {
        while( true ) {
          while( true ) {
            while( true ) {
              if (1 < local_54) goto LAB_0097b952;
              pbVar6 = local_20 + 1;
              bVar1 = *local_20;
              local_20 = pbVar6;
              if (bVar1 == 0) {
                bVar7 = true;
                goto LAB_0097b952;
              }
              if ((bVar1 < 0x41) || (0x46 < bVar1)) break;
              local_57[local_54] = bVar1 - 0x37;
              local_54 = local_54 + 1;
            }
            if ((bVar1 < 0x30) || (0x39 < bVar1)) break;
            local_57[local_54] = bVar1 - 0x30;
            local_54 = local_54 + 1;
          }
          if ((bVar1 < 0x61) || (0x66 < bVar1)) break;
          local_57[local_54] = bVar1 + 0xa9;
          local_54 = local_54 + 1;
        }
      } while (bVar1 == 0x2d);
      bVar7 = true;
LAB_0097b952:
      if (bVar7) break;
      *(char *)((long)&bi + (long)ON_UuidFromString::rho[iStack_50]) =
           local_57[0] * '\x10' + local_57[1];
    }
  }
  if (bVar7) {
    bi = 0;
    uStack_44 = 0;
    uStack_42 = 0;
    u._0_1_ = '\0';
    u._1_1_ = '\0';
    u._2_1_ = '\0';
    u._3_1_ = '\0';
    u._4_1_ = '\0';
    u._5_1_ = '\0';
    u._6_1_ = '\0';
    u._7_1_ = '\0';
  }
  OVar3.Data4[0] = u._0_1_;
  OVar3.Data4[1] = u._1_1_;
  OVar3.Data4[2] = u._2_1_;
  OVar3.Data4[3] = u._3_1_;
  OVar3.Data4[4] = u._4_1_;
  OVar3.Data4[5] = u._5_1_;
  OVar3.Data4[6] = u._6_1_;
  OVar3.Data4[7] = u._7_1_;
  OVar3.Data1 = bi;
  OVar3.Data2 = uStack_44;
  OVar3.Data3 = uStack_42;
  return OVar3;
}

Assistant:

ON_UUID ON_UuidFromString( const char* sUUID )
{
  // NOTE WELL: This code has to work on non-Windows OSs and on
  //            both big and little endian CPUs.  On Windows OSs
  //            is must return the same result as 
  //            Windows's UuidFromString().
  //

  // string has format like "85A08515-F383-11d3-BFE7-0010830122F0"
  // or like "{85A08515-F383-11d3-BFE7-0010830122F0}".  Brackets
  // and hyphens are optional and ignored.
  //
  // Windows users can use "guidgen" to create UUID strings.

  /*
#if defined(ON_DEBUG) && defined(ON_RUNTIME_WIN)
  RPC_STATUS st;
  union 
  {
    ON_UUID uuid;
    unsigned char b[16];
  } u1;
  st = UuidFromString( (unsigned char*)sUUID, &u1.uuid );
#endif
*/

  static const int* rho = (ON::endian::big_endian == ON::Endian())
                        ? big_endian_rho 
                        : little_endian_rho;

  union 
  {
    ON_UUID uuid;
    unsigned char b[16];
  } u;
  bool bFailed;
  int bi, ci;
  unsigned char c;
  unsigned char byte_value[2];

  memset(&u,0,sizeof(u));
  //for ( bi = 0; bi < 16; bi++ ) 
  //  u.b[bi] = 0;

  bFailed = sUUID ? false : true;

  if ( !bFailed ) {
    while ( *sUUID && *sUUID <= ' ' ) // skip leading white space
      sUUID++;
    if ( *sUUID == '{' )
      sUUID++;
    for ( bi = 0; bi < 16; bi++ ) {
      ci = 0;
      byte_value[0] = 0;
      byte_value[1] = 0;
      while ( ci < 2 ) {
        c = *sUUID++;
        if ( !c ) {
          bFailed = true;
          break;
        }
        if ( c >= 'A' && c <= 'F' ) {
          byte_value[ci++] = (c-'A'+10);
        }
        else if ( c >= '0' && c <='9' ) {
          byte_value[ci++] = (c-'0');
        }
        else if ( c >= 'a' && c <= 'f' ) {
          byte_value[ci++] = (c-'a'+10);
        }
        else if ( c != '-' ) {
          bFailed = true;
          break;
        }
      }
      if ( bFailed )
        break;
      u.b[rho[bi]] = 16*byte_value[0] + byte_value[1];
    }
  }

  if ( bFailed ) {
    // 09 August 2006 John Morse
    // There are times when Rhino is looking for a plug-in but the SDK or command
    // allows the plug-in to be specified by name or UUID.  Rhino calls ON_UuidFromString()
    // to see if the string is a plug-in UUID so it knows if it should be comparing the string
    // or plug-in name when looking for a plug-in.  The ON_ERROR line makes the Rhino commands
    // generate an OpenNURBS message box (in DEBUG builds) when the command completes and is
    // a pain so I commented it out per Dale Lear.
    //ON_ERROR("ON_UuidFromString(): bad string passed in");
    u.uuid = ON_nil_uuid;
  }

/*
#if defined(ON_DEBUG) && defined(ON_RUNTIME_WIN)
  if ( memcmp( &u.uuid, &u1.uuid, 16 ) ) {
    ON_ERROR("ON_UuidFromString() failed");
  }
  if ( UuidCompare( &u.uuid, &u1.uuid, &st ) ) {
    ON_ERROR("ON_UuidFromString() failed");
  }
  if ( ON_UuidCompare( &u.uuid, &u1.uuid ) ) {
    ON_ERROR("ON_UuidCompare() failed");
  }
#endif
*/
  return u.uuid;
}